

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

PClassActor * __thiscall AActor::GetBloodType(AActor *this,int type)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PClass *pPVar3;
  PClassActor *pPVar4;
  FName *zaname;
  FName local_14 [3];
  
  if (type == 2) {
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var_01,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    uVar2 = *(uint *)((long)&pPVar3[1].SpecialInits.Array + 4);
    zaname = local_14 + 2;
  }
  else if (type == 1) {
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    uVar2 = *(uint *)&pPVar3[1].SpecialInits.Array;
    zaname = local_14 + 1;
  }
  else {
    if (type != 0) {
      return (PClassActor *)0x0;
    }
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    uVar2 = pPVar3[1].super_PStruct.Fields.Count;
    zaname = local_14;
  }
  zaname->Index = uVar2;
  pPVar3 = PClass::FindClass(zaname);
  pPVar4 = dyn_cast<PClassActor>((DObject *)pPVar3);
  if (pPVar4 == (PClassActor *)0x0) {
    return (PClassActor *)0x0;
  }
  pPVar4 = PClassActor::GetReplacement(pPVar4,true);
  return pPVar4;
}

Assistant:

PClassActor *GetBloodType(int type = 0) const
	{
		PClassActor *bloodcls;
		if (type == 0)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType);
		}
		else if (type == 1)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType2);
		}
		else if (type == 2)
		{
			bloodcls = PClass::FindActor(GetClass()->BloodType3);
		}
		else
		{
			return NULL;
		}

		if (bloodcls != NULL)
		{
			bloodcls = bloodcls->GetReplacement();
		}
		return bloodcls;
	}